

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  exception *e;
  
  test_buffer();
  basic_io();
  readv_writev();
  get_set_srv();
  test_async_connect();
  test_async_connect_fail();
  test_unix();
  test_ipv6();
  test_pair();
  test_async_send_recv();
  test_cancel_operations();
  test_full_read_write();
  test_full_async_read_write();
  test_close();
  this = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
	try {
		test_buffer();
		basic_io();
		readv_writev();
		get_set_srv();
		test_async_connect();
		test_async_connect_fail();
		test_unix();
		test_ipv6();
		test_pair();
		test_async_send_recv();
		test_cancel_operations();
		test_full_read_write();
		test_full_async_read_write();
		test_close();
	}

	catch(std::exception const &e)
	{
		std::cout<<"Failed:"<< e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}